

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int __thiscall
ON_MeshParameters::GeometrySettingsDensityPercentage
          (ON_MeshParameters *this,int no_match_found_result)

{
  int iVar1;
  double dVar2;
  int n;
  double slider_value;
  int no_match_found_result_local;
  ON_MeshParameters *this_local;
  
  dVar2 = MeshDensity(this);
  if ((0.0 <= dVar2) && (dVar2 <= 1.0)) {
    dVar2 = floor(dVar2 * 100.0 + 0.4999);
    iVar1 = (int)dVar2;
    if ((-1 < iVar1) && (iVar1 < 0x65)) {
      return iVar1;
    }
  }
  return no_match_found_result;
}

Assistant:

const int ON_MeshParameters::GeometrySettingsDensityPercentage(
  int no_match_found_result
  ) const
{
  const double slider_value = this->MeshDensity();
  if (slider_value >= 0.0 && slider_value <= 1.0)
  {
    const int n = (int)floor(100.0 * slider_value + 0.4999);
    if (n >= 0 && n <= 100)
      return n;

    // The code BELOW is slower and less reliable. Different platforms and code convert 
    // user interface int values to normalized double "slider value" slightly differently.
    // (Some user interface controls use int ranges that are not multiples of 10 or are greater than 100).
    // The code ABOVE will insures if a "simple slider" user interface set the mesh parameters,
    // then this function will return an integer between 0 and 100 that produces
    // identical or nearly identical meshing parameters.
    //
    // NO //for (int n = 0; n <= 100; n++)
    // NO //{
    // NO //  double density = (50 == n) ? 0.5 : (n / 100.0);
    // NO //  ON_MeshParameters mp_at_n = ON_MeshParameters::CreateFromMeshDensity(density);
    // NO //  mp_at_n.m_bDoublePrecision = m_bDoublePrecision;
    // NO //  mp_at_n.m_texture_range = m_texture_range;
    // NO //  if (0 == ON_MeshParameters::CompareGeometrySettings(mp_at_n, *this))
    // NO //    return n;
    // NO //}
  }
  return no_match_found_result;
}